

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect __thiscall ImGuiWindow::MenuBarRect(ImGuiWindow *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImRect IVar4;
  
  fVar2 = 0.0;
  fVar3 = 0.0;
  if ((this->Flags & 1U) == 0) {
    fVar3 = (GImGui->Style).FramePadding.y;
    fVar3 = fVar3 + fVar3 + GImGui->FontBaseSize * this->FontWindowScale;
  }
  fVar1 = (this->Pos).x;
  if (((uint)this->Flags >> 10 & 1) != 0) {
    fVar2 = (GImGui->Style).FramePadding.y;
    fVar2 = fVar2 + fVar2 +
            GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
  }
  IVar4.Max.x = (this->SizeFull).x + fVar1;
  fVar3 = (this->Pos).y + fVar3;
  IVar4.Max.y = fVar2 + fVar3;
  IVar4.Min.y = fVar3;
  IVar4.Min.x = fVar1;
  return IVar4;
}

Assistant:

float       MenuBarHeight() const                   { return (Flags & ImGuiWindowFlags_MenuBar) ? DC.MenuBarOffset.y + CalcFontSize() + GImGui->Style.FramePadding.y * 2.0f : 0.0f; }